

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O1

lzma_stream * stream::init_raw_lzma_stream(lzma_vli filter,lzma_options_lzma *options)

{
  int iVar1;
  lzma_stream *__s;
  string *psVar2;
  lzma_filter filters [2];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  lzma_vli local_48;
  lzma_options_lzma *local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  options->preset_dict = (uint8_t *)0x0;
  __s = (lzma_stream *)operator_new(0x88);
  memset(__s,0,0x88);
  local_38 = 0xffffffffffffffff;
  local_30 = 0;
  local_48 = filter;
  local_40 = options;
  iVar1 = lzma_raw_decoder(__s);
  if (iVar1 == 0) {
    return __s;
  }
  operator_delete(__s,0x88);
  psVar2 = (string *)__cxa_allocate_exception(0x28);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,"inno lzma init error","");
  std::ios_base::failure[abi:cxx11]::failure(psVar2);
  *(undefined ***)psVar2 = &PTR__failure_00173700;
  *(int *)(psVar2 + 0x20) = iVar1;
  __cxa_throw(psVar2,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

static lzma_stream * init_raw_lzma_stream(lzma_vli filter, lzma_options_lzma & options) {
	
	options.preset_dict = NULL;
	
	lzma_stream * strm = new lzma_stream;
	lzma_stream tmp = LZMA_STREAM_INIT;
	*strm = tmp;
	strm->allocator = NULL;
	
	const lzma_filter filters[2] = { { filter,  &options }, { LZMA_VLI_UNKNOWN, NULL } };
	lzma_ret ret = lzma_raw_decoder(strm, filters);
	if(ret != LZMA_OK) {
		delete strm;
		throw lzma_error("inno lzma init error", ret);
	}
	
	return strm;
}